

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O2

bool __thiscall Builder::StartEdge(Builder *this,Edge *edge,string *err)

{
  CommandRunner *pCVar1;
  Metrics *this_00;
  bool bVar2;
  char cVar3;
  int iVar4;
  int64_t iVar5;
  Metric *pMVar6;
  bool bVar7;
  size_type sVar8;
  pointer ppNVar9;
  string rspfile;
  string content;
  ScopedMetric metrics_h_scoped;
  string local_b8;
  string local_98;
  string local_78;
  ScopedMetric local_58;
  string local_48;
  
  if (StartEdge(Edge*,std::__cxx11::string*)::metrics_h_metric == '\0') {
    iVar4 = __cxa_guard_acquire(&StartEdge(Edge*,std::__cxx11::string*)::metrics_h_metric);
    this_00 = g_metrics;
    if (iVar4 != 0) {
      if (g_metrics == (Metrics *)0x0) {
        pMVar6 = (Metric *)0x0;
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b8,"StartEdge",(allocator<char> *)&local_78);
        pMVar6 = Metrics::NewMetric(this_00,&local_b8);
        std::__cxx11::string::~string((string *)&local_b8);
      }
      StartEdge::metrics_h_metric = pMVar6;
      __cxa_guard_release(&StartEdge(Edge*,std::__cxx11::string*)::metrics_h_metric);
    }
  }
  ScopedMetric::ScopedMetric(&local_58,StartEdge::metrics_h_metric);
  bVar2 = Edge::is_phony(edge);
  bVar7 = true;
  if (!bVar2) {
    iVar5 = GetTimeMillis();
    sVar8 = iVar5 - this->start_time_millis_;
    local_b8._M_dataplus._M_p = (pointer)edge;
    local_b8._M_string_length = sVar8;
    std::
    _Rb_tree<Edge_const*,std::pair<Edge_const*const,int>,std::_Select1st<std::pair<Edge_const*const,int>>,std::less<Edge_const*>,std::allocator<std::pair<Edge_const*const,int>>>
    ::_M_emplace_unique<std::pair<Edge*,long>>
              ((_Rb_tree<Edge_const*,std::pair<Edge_const*const,int>,std::_Select1st<std::pair<Edge_const*const,int>>,std::less<Edge_const*>,std::allocator<std::pair<Edge_const*const,int>>>
                *)&this->running_edges_,(pair<Edge_*,_long> *)&local_b8);
    (*this->status_->_vptr_Status[1])(this->status_,edge,sVar8);
    ppNVar9 = (edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      if (ppNVar9 ==
          (edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        Edge::GetUnescapedRspfile_abi_cxx11_(&local_b8,edge);
        if (local_b8._M_string_length == 0) {
LAB_00109648:
          pCVar1 = (this->command_runner_)._M_t.
                   super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
                   super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
                   super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
          iVar4 = (*pCVar1->_vptr_CommandRunner[4])(pCVar1,edge);
          bVar7 = true;
          if ((char)iVar4 == '\0') {
            Edge::EvaluateCommand_abi_cxx11_(&local_48,edge,false);
            std::operator+(&local_98,"command \'",&local_48);
            std::operator+(&local_78,&local_98,"\' failed.");
            std::__cxx11::string::operator=((string *)err,(string *)&local_78);
            std::__cxx11::string::~string((string *)&local_78);
            std::__cxx11::string::~string((string *)&local_98);
            std::__cxx11::string::~string((string *)&local_48);
            goto LAB_001096c6;
          }
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_98,"rspfile_content",(allocator<char> *)&local_48);
          Edge::GetBinding(&local_78,edge,&local_98);
          std::__cxx11::string::~string((string *)&local_98);
          cVar3 = (**(code **)(*(long *)this->disk_interface_ + 0x28))
                            (this->disk_interface_,&local_b8,&local_78);
          std::__cxx11::string::~string((string *)&local_78);
          if (cVar3 != '\0') goto LAB_00109648;
LAB_001096c6:
          bVar7 = false;
        }
        std::__cxx11::string::~string((string *)&local_b8);
        goto LAB_001096d0;
      }
      bVar2 = DiskInterface::MakeDirs(this->disk_interface_,&(*ppNVar9)->path_);
      ppNVar9 = ppNVar9 + 1;
    } while (bVar2);
    bVar7 = false;
  }
LAB_001096d0:
  ScopedMetric::~ScopedMetric(&local_58);
  return bVar7;
}

Assistant:

bool Builder::StartEdge(Edge* edge, string* err) {
  METRIC_RECORD("StartEdge");
  if (edge->is_phony())
    return true;

  int64_t start_time_millis = GetTimeMillis() - start_time_millis_;
  running_edges_.insert(make_pair(edge, start_time_millis));

  status_->BuildEdgeStarted(edge, start_time_millis);

  // Create directories necessary for outputs.
  // XXX: this will block; do we care?
  for (vector<Node*>::iterator o = edge->outputs_.begin();
       o != edge->outputs_.end(); ++o) {
    if (!disk_interface_->MakeDirs((*o)->path()))
      return false;
  }

  // Create response file, if needed
  // XXX: this may also block; do we care?
  string rspfile = edge->GetUnescapedRspfile();
  if (!rspfile.empty()) {
    string content = edge->GetBinding("rspfile_content");
    if (!disk_interface_->WriteFile(rspfile, content))
      return false;
  }

  // start command computing and run it
  if (!command_runner_->StartCommand(edge)) {
    err->assign("command '" + edge->EvaluateCommand() + "' failed.");
    return false;
  }

  return true;
}